

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::quadratic_cost_type<float>::make_l1_norm(quadratic_cost_type<float> *this,int n)

{
  float *pfVar1;
  float *pfVar2;
  quad *pqVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  undefined8 uVar18;
  ulong uVar19;
  byte bVar20;
  byte bVar21;
  ulong uVar22;
  ulong uVar23;
  long unaff_RBX;
  ushort uVar24;
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar25 [32];
  
  if (n == 0) {
    auVar32 = ZEXT864(0);
  }
  else {
    auVar33._8_4_ = 0x7fffffff;
    auVar33._0_8_ = 0x7fffffff7fffffff;
    auVar33._12_4_ = 0x7fffffff;
    auVar32 = ZEXT864(0);
    uVar22 = 0;
    do {
      pfVar2 = (this->linear_elements)._M_t.
               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar22;
      uVar22 = uVar22 + 1;
      auVar34 = vandps_avx(ZEXT416((uint)*pfVar2),auVar33);
      auVar32 = ZEXT464((uint)(auVar32._0_4_ + auVar34._0_4_));
    } while ((uint)n != uVar22);
  }
  auVar33 = auVar32._0_16_;
  uVar22 = (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
                        ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl[n];
  if (uVar22 != 0) {
    auVar34._8_4_ = 0x7fffffff;
    auVar34._0_8_ = 0x7fffffff7fffffff;
    auVar34._12_4_ = 0x7fffffff;
    uVar23 = 0;
    do {
      pqVar3 = (this->quadratic_elements)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
               .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
               _M_head_impl + uVar23;
      uVar23 = uVar23 + 1;
      auVar33 = vandps_avx(ZEXT416((uint)pqVar3->factor),auVar34);
      fVar17 = auVar32._0_4_ + auVar33._0_4_;
      auVar32 = ZEXT464((uint)fVar17);
      auVar33 = ZEXT416((uint)fVar17);
    } while (uVar22 != uVar23);
  }
  if ((auVar33._0_4_ & 0x7fffffff) - 0x800000 < 0x7f000000) {
    if (n != 0) {
      auVar32 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      pfVar2 = (this->linear_elements)._M_t.
               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      auVar28 = vbroadcastss_avx512f(auVar33);
      auVar29 = vpbroadcastq_avx512f();
      uVar23 = 0;
      do {
        auVar30 = vpbroadcastq_avx512f();
        auVar31 = vporq_avx512f(auVar30,auVar32);
        auVar30 = vporq_avx512f(auVar30,auVar27);
        uVar18 = vpcmpuq_avx512f(auVar30,auVar29,2);
        bVar20 = (byte)uVar18;
        uVar18 = vpcmpuq_avx512f(auVar31,auVar29,2);
        bVar21 = (byte)uVar18;
        uVar24 = CONCAT11(bVar21,bVar20);
        pfVar1 = pfVar2 + uVar23;
        auVar30._4_4_ = (uint)((byte)(uVar24 >> 1) & 1) * (int)pfVar1[1];
        auVar30._0_4_ = (uint)(bVar20 & 1) * (int)*pfVar1;
        auVar30._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * (int)pfVar1[2];
        auVar30._12_4_ = (uint)((byte)(uVar24 >> 3) & 1) * (int)pfVar1[3];
        auVar30._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * (int)pfVar1[4];
        auVar30._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * (int)pfVar1[5];
        auVar30._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * (int)pfVar1[6];
        auVar30._28_4_ = (uint)((byte)(uVar24 >> 7) & 1) * (int)pfVar1[7];
        auVar30._32_4_ = (uint)(bVar21 & 1) * (int)pfVar1[8];
        auVar30._36_4_ = (uint)(bVar21 >> 1 & 1) * (int)pfVar1[9];
        auVar30._40_4_ = (uint)(bVar21 >> 2 & 1) * (int)pfVar1[10];
        auVar30._44_4_ = (uint)(bVar21 >> 3 & 1) * (int)pfVar1[0xb];
        auVar30._48_4_ = (uint)(bVar21 >> 4 & 1) * (int)pfVar1[0xc];
        auVar30._52_4_ = (uint)(bVar21 >> 5 & 1) * (int)pfVar1[0xd];
        auVar30._56_4_ = (uint)(bVar21 >> 6 & 1) * (int)pfVar1[0xe];
        auVar30._60_4_ = (uint)(bVar21 >> 7) * (int)pfVar1[0xf];
        auVar30 = vdivps_avx512f(auVar30,auVar28);
        pfVar1 = pfVar2 + uVar23;
        bVar4 = (bool)((byte)(uVar24 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar24 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar24 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar24 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar24 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar24 >> 6) & 1);
        bVar10 = (bool)((byte)(uVar24 >> 7) & 1);
        bVar11 = (bool)(bVar21 >> 1 & 1);
        bVar12 = (bool)(bVar21 >> 2 & 1);
        bVar13 = (bool)(bVar21 >> 3 & 1);
        bVar14 = (bool)(bVar21 >> 4 & 1);
        bVar15 = (bool)(bVar21 >> 5 & 1);
        bVar16 = (bool)(bVar21 >> 6 & 1);
        *pfVar1 = (float)((uint)(bVar20 & 1) * auVar30._0_4_ |
                         (uint)!(bool)(bVar20 & 1) * (int)*pfVar1);
        pfVar1[1] = (float)((uint)bVar4 * auVar30._4_4_ | (uint)!bVar4 * (int)pfVar1[1]);
        pfVar1[2] = (float)((uint)bVar5 * auVar30._8_4_ | (uint)!bVar5 * (int)pfVar1[2]);
        pfVar1[3] = (float)((uint)bVar6 * auVar30._12_4_ | (uint)!bVar6 * (int)pfVar1[3]);
        pfVar1[4] = (float)((uint)bVar7 * auVar30._16_4_ | (uint)!bVar7 * (int)pfVar1[4]);
        pfVar1[5] = (float)((uint)bVar8 * auVar30._20_4_ | (uint)!bVar8 * (int)pfVar1[5]);
        pfVar1[6] = (float)((uint)bVar9 * auVar30._24_4_ | (uint)!bVar9 * (int)pfVar1[6]);
        pfVar1[7] = (float)((uint)bVar10 * auVar30._28_4_ | (uint)!bVar10 * (int)pfVar1[7]);
        pfVar1[8] = (float)((uint)(bVar21 & 1) * auVar30._32_4_ |
                           (uint)!(bool)(bVar21 & 1) * (int)pfVar1[8]);
        pfVar1[9] = (float)((uint)bVar11 * auVar30._36_4_ | (uint)!bVar11 * (int)pfVar1[9]);
        pfVar1[10] = (float)((uint)bVar12 * auVar30._40_4_ | (uint)!bVar12 * (int)pfVar1[10]);
        pfVar1[0xb] = (float)((uint)bVar13 * auVar30._44_4_ | (uint)!bVar13 * (int)pfVar1[0xb]);
        pfVar1[0xc] = (float)((uint)bVar14 * auVar30._48_4_ | (uint)!bVar14 * (int)pfVar1[0xc]);
        pfVar1[0xd] = (float)((uint)bVar15 * auVar30._52_4_ | (uint)!bVar15 * (int)pfVar1[0xd]);
        pfVar1[0xe] = (float)((uint)bVar16 * auVar30._56_4_ | (uint)!bVar16 * (int)pfVar1[0xe]);
        pfVar1[0xf] = (float)((uint)(bVar21 >> 7) * auVar30._60_4_ |
                             (uint)!(bool)(bVar21 >> 7) * (int)pfVar1[0xf]);
        uVar23 = uVar23 + 0x10;
      } while (((ulong)(uint)n + 0xf & 0x1fffffff0) != uVar23);
    }
    if (uVar22 != 0) {
      auVar32 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar28 = vpbroadcastq_avx512f(ZEXT816(0x10));
      pqVar3 = (this->quadratic_elements)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
               .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
               _M_head_impl;
      auVar29 = vbroadcastss_avx512f(auVar33);
      uVar22 = uVar22 + 0xf & 0x1fffffff0;
      auVar30 = vpbroadcastq_avx512f();
      do {
        uVar23 = vpcmpuq_avx512f(auVar32,auVar30,2);
        uVar19 = vpcmpuq_avx512f(auVar27,auVar30,2);
        uVar22 = uVar22 - 0x10;
        auVar25 = vgatherqps_avx512f(*(undefined8 *)((long)pqVar3 * 9));
        auVar26._8_8_ = (ulong)((byte)(uVar23 >> 1) & 1) * auVar25._8_8_;
        auVar26._0_8_ = (ulong)((byte)uVar23 & 1) * auVar25._0_8_;
        auVar26._16_8_ = (ulong)((byte)(uVar23 >> 2) & 1) * auVar25._16_8_;
        auVar26._24_8_ = (ulong)((byte)(uVar23 >> 3) & 1) * auVar25._24_8_;
        auVar25 = vgatherqps_avx512f(pqVar3[unaff_RBX]);
        auVar31 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT824((ulong)((byte)(uVar19 >> 3) & 1) * auVar25._24_8_,
                                                CONCAT816((ulong)((byte)(uVar19 >> 2) & 1) *
                                                          auVar25._16_8_,
                                                          CONCAT88((ulong)((byte)(uVar19 >> 1) & 1)
                                                                   * auVar25._8_8_,
                                                                   (ulong)((byte)uVar19 & 1) *
                                                                   auVar25._0_8_)))),auVar26,1);
        auVar31 = vdivps_avx512f(auVar31,auVar29);
        vscatterqps_avx512f(ZEXT864(pqVar3) + auVar27 * (undefined1  [64])0x8,uVar19,auVar31._0_32_)
        ;
        auVar25 = vextractf64x4_avx512f(auVar31,1);
        auVar27 = vpaddq_avx512f(auVar27,auVar28);
        vscatterqps_avx512f(ZEXT864(pqVar3) + auVar32 * (undefined1  [64])0x8,uVar23,auVar25);
        auVar32 = vpaddq_avx512f(auVar32,auVar28);
      } while (uVar22 != 0);
    }
  }
  return;
}

Assistant:

void make_l1_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += std::abs(linear_elements[i]);

        for (int i = 0, e = indices[n]; i != e; ++i)
            div += std::abs(quadratic_elements[i].factor);

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }